

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O3

CloudNode * Cloud_bddAnd(CloudManager *dd,CloudNode *f,CloudNode *g)

{
  byte bVar1;
  CloudCacheEntry2 *pCVar2;
  CloudNode *pCVar3;
  
  if (g < (CloudNode *)0x2 || f < (CloudNode *)0x2) {
    return (CloudNode *)0x0;
  }
  pCVar3 = dd->tUnique;
  if ((pCVar3 <= f) && (f < pCVar3 + dd->nNodesAlloc)) {
    if ((pCVar3 <= g) && (g < pCVar3 + dd->nNodesAlloc)) {
      if (dd->tCaches[0] == (CloudCacheEntry2 *)0x0) {
        bVar1 = (byte)dd->bitsCache[0];
        pCVar2 = (CloudCacheEntry2 *)calloc((long)(1 << (bVar1 & 0x1f)),0x20);
        dd->tCaches[0] = pCVar2;
        dd->nMemUsed = dd->nMemUsed + (0x20 << (bVar1 & 0x1f));
      }
      pCVar3 = g;
      if (g < f) {
        pCVar3 = f;
        f = g;
      }
      pCVar3 = cloudBddAnd(dd,f,pCVar3);
      return pCVar3;
    }
    __assert_fail("(g) >= dd->tUnique && (g) < dd->tUnique+dd->nNodesAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/cloud.c"
                  ,0x1ee,"CloudNode *Cloud_bddAnd(CloudManager *, CloudNode *, CloudNode *)");
  }
  __assert_fail("(f) >= dd->tUnique && (f) < dd->tUnique+dd->nNodesAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/cloud.c"
                ,0x1ed,"CloudNode *Cloud_bddAnd(CloudManager *, CloudNode *, CloudNode *)");
}

Assistant:

CloudNode * Cloud_bddAnd( CloudManager * dd, CloudNode * f, CloudNode * g )
{
    if ( Cloud_Regular(f) == NULL || Cloud_Regular(g) == NULL )
        return NULL;
    CLOUD_ASSERT(f);
    CLOUD_ASSERT(g);
    if ( dd->tCaches[CLOUD_OPER_AND] == NULL )
        cloudCacheAllocate( dd, CLOUD_OPER_AND );
    return cloudBddAnd_gate( dd, f, g );
}